

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void wb_write_uniform(aom_write_bit_buffer *wb,int n,int v)

{
  int data;
  int bits;
  int in_EDX;
  int in_ESI;
  int m;
  int l;
  
  data = get_unsigned_bits(0);
  bits = (1 << ((byte)data & 0x1f)) - in_ESI;
  if (data != 0) {
    if (in_EDX < bits) {
      aom_wb_write_literal((aom_write_bit_buffer *)CONCAT44(in_ESI,in_EDX),data,bits);
    }
    else {
      aom_wb_write_literal((aom_write_bit_buffer *)CONCAT44(in_ESI,in_EDX),data,bits);
      aom_wb_write_literal((aom_write_bit_buffer *)CONCAT44(in_ESI,in_EDX),data,bits);
    }
  }
  return;
}

Assistant:

static inline void wb_write_uniform(struct aom_write_bit_buffer *wb, int n,
                                    int v) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  if (l == 0) return;
  if (v < m) {
    aom_wb_write_literal(wb, v, l - 1);
  } else {
    aom_wb_write_literal(wb, m + ((v - m) >> 1), l - 1);
    aom_wb_write_literal(wb, (v - m) & 1, 1);
  }
}